

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O0

int ModelFrameHash(FSpriteModelFrame *smf)

{
  DWORD *crcTable;
  char *se;
  char *s;
  uint32_t hash;
  uint32_t *table;
  FSpriteModelFrame *smf_local;
  
  crcTable = GetCRCTable();
  s._4_4_ = 0xffffffff;
  for (se = (char *)&smf->type; se < &smf->hashnext; se = se + 1) {
    s._4_4_ = CRC1(s._4_4_,*se,crcTable);
  }
  return s._4_4_ ^ 0xffffffff;
}

Assistant:

static int ModelFrameHash(FSpriteModelFrame * smf)
{
	const uint32_t *table = GetCRCTable ();
	uint32_t hash = 0xffffffff;

	const char * s = (const char *)(&smf->type);	// this uses type, sprite and frame for hashing
	const char * se= (const char *)(&smf->hashnext);

	for (; s<se; s++)
	{
		hash = CRC1 (hash, *s, table);
	}
	return hash ^ 0xffffffff;
}